

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O1

void nn_bws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  undefined4 uVar1;
  int iVar2;
  nn_list_item *it;
  nn_list_item *pnVar3;
  nn_aws *self_01;
  
  if (type == -3 && src == -2) {
    if ((nn_aws *)self[8].shutdown_fn == (nn_aws *)0x0) {
      uVar1 = 4;
    }
    else {
      nn_aws_stop((nn_aws *)self[8].shutdown_fn);
      uVar1 = 3;
    }
    *(undefined4 *)&self[1].fn = uVar1;
  }
  if (*(int *)&self[1].fn == 3) {
    iVar2 = nn_aws_isidle((nn_aws *)self[8].shutdown_fn);
    if (iVar2 == 0) {
      return;
    }
    nn_aws_term((nn_aws *)self[8].shutdown_fn);
    nn_free(self[8].shutdown_fn);
    self[8].shutdown_fn = (nn_fsm_fn)0x0;
    nn_usock_stop((nn_usock *)&self[1].state);
    *(undefined4 *)&self[1].fn = 4;
  }
  iVar2 = *(int *)&self[1].fn;
  if (iVar2 == 5) {
    if ((src != 2) || (type != 0x85b9)) {
      nn_bws_shutdown_cold_1();
      goto LAB_0015bc02;
    }
    nn_list_erase((nn_list *)&self[8].state,(nn_list_item *)((long)srcptr + 0x1b70));
    nn_aws_term((nn_aws *)srcptr);
    nn_free(srcptr);
  }
  else {
    if (iVar2 != 4) {
LAB_0015bc02:
      nn_bws_shutdown_cold_2();
    }
    iVar2 = nn_usock_isidle((nn_usock *)&self[1].state);
    if (iVar2 == 0) {
      return;
    }
    self_00 = &self[8].state;
    for (it = nn_list_begin((nn_list *)self_00); pnVar3 = nn_list_end((nn_list *)self_00),
        it != pnVar3; it = nn_list_next((nn_list *)self_00,it)) {
      self_01 = (nn_aws *)(it + -0x1b7);
      if (it == (nn_list_item *)0x0) {
        self_01 = (nn_aws *)0x0;
      }
      nn_aws_stop(self_01);
    }
    *(undefined4 *)&self[1].fn = 5;
  }
  iVar2 = nn_list_empty((nn_list *)&self[8].state);
  if (iVar2 == 0) {
    return;
  }
  *(undefined4 *)&self[1].fn = 1;
  nn_fsm_stopped_noevent(self);
  nn_ep_stopped((nn_ep *)self[1].shutdown_fn);
  return;
}

Assistant:

static void nn_bws_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bws *bws;
    struct nn_list_item *it;
    struct nn_aws *aws;

    bws = nn_cont (self, struct nn_bws, fsm);

    if (src == NN_FSM_ACTION && type == NN_FSM_STOP) {
        if (bws->aws) {
            nn_aws_stop (bws->aws);
            bws->state = NN_BWS_STATE_STOPPING_AWS;
        }
        else {
            bws->state = NN_BWS_STATE_STOPPING_USOCK;
        }
    }
    if (bws->state == NN_BWS_STATE_STOPPING_AWS) {
        if (!nn_aws_isidle (bws->aws))
            return;
        nn_aws_term (bws->aws);
        nn_free (bws->aws);
        bws->aws = NULL;
        nn_usock_stop (&bws->usock);
        bws->state = NN_BWS_STATE_STOPPING_USOCK;
    }
    if (bws->state == NN_BWS_STATE_STOPPING_USOCK) {
       if (!nn_usock_isidle (&bws->usock))
            return;
        for (it = nn_list_begin (&bws->awss);
              it != nn_list_end (&bws->awss);
              it = nn_list_next (&bws->awss, it)) {
            aws = nn_cont (it, struct nn_aws, item);
            nn_aws_stop (aws);
        }
        bws->state = NN_BWS_STATE_STOPPING_AWSS;
        goto awss_stopping;
    }
    if (bws->state == NN_BWS_STATE_STOPPING_AWSS) {
        nn_assert (src == NN_BWS_SRC_AWS && type == NN_AWS_STOPPED);
        aws = (struct nn_aws *) srcptr;
        nn_list_erase (&bws->awss, &aws->item);
        nn_aws_term (aws);
        nn_free (aws);

        /*  If there are no more aws state machines, we can stop the whole
            bws object. */
awss_stopping:
        if (nn_list_empty (&bws->awss)) {
            bws->state = NN_BWS_STATE_IDLE;
            nn_fsm_stopped_noevent (&bws->fsm);
            nn_ep_stopped (bws->ep);
            return;
        }

        return;
    }

    nn_fsm_bad_action (bws->state, src, type);
}